

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathFreeParserContext(xmlXPathParserContextPtr ctxt)

{
  long lVar1;
  
  if (ctxt->valueTab != (xmlXPathObjectPtr *)0x0) {
    if (0 < ctxt->valueNr) {
      lVar1 = 0;
      do {
        if (ctxt->context == (xmlXPathContextPtr)0x0) {
          xmlXPathFreeObject(ctxt->valueTab[lVar1]);
        }
        else {
          xmlXPathReleaseObject(ctxt->context,ctxt->valueTab[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < ctxt->valueNr);
    }
    (*xmlFree)(ctxt->valueTab);
  }
  if (ctxt->comp != (xmlXPathCompExprPtr)0x0) {
    xmlXPathFreeCompExpr(ctxt->comp);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlXPathFreeParserContext(xmlXPathParserContextPtr ctxt) {
    int i;

    if (ctxt->valueTab != NULL) {
        for (i = 0; i < ctxt->valueNr; i++) {
            if (ctxt->context)
                xmlXPathReleaseObject(ctxt->context, ctxt->valueTab[i]);
            else
                xmlXPathFreeObject(ctxt->valueTab[i]);
        }
        xmlFree(ctxt->valueTab);
    }
    if (ctxt->comp != NULL) {
#ifdef XPATH_STREAMING
	if (ctxt->comp->stream != NULL) {
	    xmlFreePatternList(ctxt->comp->stream);
	    ctxt->comp->stream = NULL;
	}
#endif
	xmlXPathFreeCompExpr(ctxt->comp);
    }
    xmlFree(ctxt);
}